

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.c
# Opt level: O0

void init_sound(void)

{
  float fVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  int i;
  int len;
  char *p;
  float val;
  float vol;
  float freq2;
  float freq1;
  float osc2;
  float osc1;
  float f;
  undefined8 in_stack_ffffffffffffff90;
  int local_30;
  undefined1 *local_28;
  float local_1c;
  float local_14;
  float local_10;
  float local_c;
  float local_8;
  
  uVar3 = al_is_audio_installed();
  if ((uVar3 & 1) != 0) {
    zap = create_sample_u8((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                           (int)in_stack_ffffffffffffff90);
    local_28 = (undefined1 *)al_get_sample_data(zap);
    local_8 = 0.0;
    local_10 = 0.02;
    local_c = 0.0;
    local_14 = 0.025;
    for (local_30 = 0; local_30 < 0x2000; local_30 = local_30 + 1) {
      dVar4 = fmod((double)local_8,1.0);
      dVar5 = fmod((double)local_c,1.0);
      *local_28 = (char)(int)(((dVar4 + dVar5) - 1.0) *
                              (double)(((float)(0x2000 - local_30) / 8192.0) * 127.0) + 128.0);
      local_8 = local_10 + local_8;
      local_10 = local_10 - 1e-06;
      local_c = local_14 + local_c;
      local_14 = local_14 - 1.25e-06;
      local_28 = local_28 + 1;
    }
    bang = create_sample_u8((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                            (int)in_stack_ffffffffffffff90);
    local_28 = (undefined1 *)al_get_sample_data(bang);
    local_1c = 0.0;
    for (local_30 = 0; local_30 < 0x2000; local_30 = local_30 + 1) {
      uVar2 = rand();
      local_1c = local_1c * 0.75 + ((float)(uVar2 & 0xff) / 255.0 + -0.5) * 0.25;
      *local_28 = (char)(int)(local_1c * ((float)(0x2000 - local_30) / 8192.0) * 255.0 + 128.0);
      local_28 = local_28 + 1;
    }
    bigbang = create_sample_u8((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                               (int)in_stack_ffffffffffffff90);
    local_28 = (undefined1 *)al_get_sample_data(bigbang);
    local_1c = 0.0;
    local_8 = 0.0;
    local_c = 0.0;
    for (local_30 = 0; local_30 < 0x6000; local_30 = local_30 + 1) {
      fVar1 = ((float)local_30 / 24576.0) * 0.4 + 0.5;
      uVar2 = rand();
      local_1c = ((float)(uVar2 & 0xff) / 255.0 - 0.5) * (1.0 - fVar1) + local_1c * fVar1;
      dVar4 = sin((double)local_8);
      dVar5 = sin((double)local_c);
      *local_28 = (char)(int)(((double)local_1c + (dVar4 + dVar5) * 0.25) *
                              (double)(((float)(0x6000 - local_30) / 24576.0) * 128.0) + 128.0);
      local_8 = local_8 + 0.03;
      local_c = local_c + 0.04;
      local_28 = local_28 + 1;
    }
    ping = create_sample_u8((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                            (int)in_stack_ffffffffffffff90);
    local_28 = (undefined1 *)al_get_sample_data(ping);
    local_8 = 0.0;
    local_c = 0.0;
    for (local_30 = 0; local_30 < 0x2000; local_30 = local_30 + 1) {
      dVar4 = sin((double)local_8);
      dVar5 = sin((double)local_c);
      *local_28 = (char)(int)((dVar4 + dVar5 + -1.0) *
                              (double)(((float)(0x2000 - local_30) / 8192.0) * 31.0) + 128.0);
      local_8 = local_8 + 0.2;
      local_c = local_c + 0.3;
      local_28 = local_28 + 1;
    }
    ping_timer = (ALLEGRO_TIMER *)al_create_timer(0x3fd3333333333333);
    if (no_music == 0) {
      init_music();
      al_start_timer(music_timer);
    }
    sound_update_thread = (ALLEGRO_THREAD *)al_create_thread(sound_update_proc,0);
    al_start_thread(sound_update_thread);
  }
  return;
}

Assistant:

void init_sound()
{
   float f, osc1, osc2, freq1, freq2, vol, val;
   char *p;
   int len;
   int i;

   if (!al_is_audio_installed())
      return;

   /* zap (firing sound) consists of multiple falling saw waves */
   len = 8192;
   zap = create_sample_u8(22050, len);

   p = (char *)al_get_sample_data(zap);

   osc1 = 0;
   freq1 = 0.02;

   osc2 = 0;
   freq2 = 0.025;

   for (i=0; i<len; i++) {
      vol = (float)(len - i) / (float)len * 127;

      *p = 128 + (fmod(osc1, 1) + fmod(osc2, 1) - 1) * vol;

      osc1 += freq1;
      freq1 -= 0.000001;

      osc2 += freq2;
      freq2 -= 0.00000125;

      p++;
   }

   /* bang (explosion) consists of filtered noise */
   len = 8192;
   bang = create_sample_u8(22050, len);

   p = (char *)al_get_sample_data(bang);

   val = 0;

   for (i=0; i<len; i++) {
      vol = (float)(len - i) / (float)len * 255;
      val = (val * 0.75) + (RAND * 0.25);
      *p = 128 + val * vol;
      p++;
   }

   /* big bang (explosion) consists of noise plus rumble */
   len = 24576;
   bigbang = create_sample_u8(11025, len);

   p = (char *)al_get_sample_data(bigbang);

   val = 0;

   osc1 = 0;
   osc2 = 0;

   for (i=0; i<len; i++) {
      vol = (float)(len - i) / (float)len * 128;

      f = 0.5 + ((float)i / (float)len * 0.4);
      val = (val * f) + (RAND * (1-f));

      *p = 128 + (val + (sin(osc1) + sin(osc2)) / 4) * vol;

      osc1 += 0.03;
      osc2 += 0.04;

      p++;
   }

   /* ping consists of two sine waves */
   len = 8192;
   ping = create_sample_u8(22050, len);

   p = (char *)al_get_sample_data(ping);

   osc1 = 0;
   osc2 = 0;

   for (i=0; i<len; i++) {
      vol = (float)(len - i) / (float)len * 31;

      *p = 128 + (sin(osc1) + sin(osc2) - 1) * vol;

      osc1 += 0.2;
      osc2 += 0.3;

      p++;
   }

   ping_timer = al_create_timer(0.3);

   /* set up my lurvely music player :-) */
   if (!no_music) {
      init_music();
      al_start_timer(music_timer);
   }

   sound_update_thread = al_create_thread(sound_update_proc, NULL);
   al_start_thread(sound_update_thread);
}